

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaders.cpp
# Opt level: O0

bool gpu::buildShaders(void)

{
  u32 uVar1;
  GLuint GVar2;
  char *__s;
  size_t __maxlen;
  GLint local_188;
  int local_16c;
  undefined1 local_168 [4];
  int skinning_2;
  char *local_158;
  char *errs_8;
  ShaderData_FloorGrid *data_2;
  char *local_138;
  char *errs_7;
  undefined1 local_128 [4];
  u32 fragShad_1;
  char *local_118;
  char *errs_6;
  undefined1 local_108 [4];
  u32 vertShad_1;
  char *local_f8;
  char *errs_5;
  ShaderData_VertColor *data_1;
  char *local_d8;
  char *errs_4;
  undefined1 local_c8 [4];
  u32 fragShad;
  char *local_b8;
  char *errs_3;
  undefined1 local_a8 [4];
  u32 vertShad;
  char *local_98;
  char *errs_2;
  ShaderData *data;
  char *local_78;
  char *errs_1;
  u32 fragShader;
  int skinning_1;
  char *local_58;
  char *errs;
  char *local_40;
  Span<char> local_38;
  Span<char> local_28;
  int local_18;
  u32 uStack_14;
  int skinning;
  u32 vertShader [2];
  
  local_18 = 0;
  while( true ) {
    if (1 < local_18) {
      errs_1._4_4_ = 0;
      while( true ) {
        if (1 < errs_1._4_4_) {
          errs_3._4_4_ = (*glad_debug_glCreateShader)(0x8b31);
          uploadShaderSources<char_const*,char_const*>
                    (errs_3._4_4_,&src::version,&src::vertColor_vert);
          (*glad_debug_glCompileShader)(errs_3._4_4_);
          uVar1 = errs_3._4_4_;
          tl::Span<char>::Span<32768ul>((Span<char> *)local_c8,(char (*) [32768])infoLog);
          local_b8 = tg::getShaderCompileErrors(uVar1,(Span<char> *)local_c8);
          if (local_b8 == (char *)0x0) {
            errs_4._4_4_ = (*glad_debug_glCreateShader)(0x8b30);
            uploadShaderSources<char_const*,char_const*>
                      (errs_4._4_4_,&src::version,&src::vertColor_frag);
            (*glad_debug_glCompileShader)(errs_4._4_4_);
            uVar1 = errs_4._4_4_;
            tl::Span<char>::Span<32768ul>((Span<char> *)&data_1,(char (*) [32768])infoLog);
            local_d8 = tg::getShaderCompileErrors(uVar1,(Span<char> *)&data_1);
            if (local_d8 == (char *)0x0) {
              errs_5 = (char *)&sd::vertColor;
              sd::vertColor = (*glad_debug_glCreateProgram)();
              (*glad_debug_glAttachShader)(sd::vertColor,errs_3._4_4_);
              (*glad_debug_glAttachShader)(sd::vertColor,errs_4._4_4_);
              (*glad_debug_glLinkProgram)(sd::vertColor);
              GVar2 = sd::vertColor;
              tl::Span<char>::Span<32768ul>((Span<char> *)local_108,(char (*) [32768])infoLog);
              local_f8 = tg::getShaderLinkErrors(GVar2,(Span<char> *)local_108);
              if (local_f8 == (char *)0x0) {
                (*glad_debug_glDetachShader)(sd::vertColor,errs_3._4_4_);
                (*glad_debug_glDetachShader)(sd::vertColor,errs_4._4_4_);
                (*glad_debug_glDeleteShader)(errs_3._4_4_);
                (*glad_debug_glDeleteShader)(errs_4._4_4_);
                _DAT_004040fc = (*glad_debug_glGetUniformLocation)(sd::vertColor,"u_modelViewProj");
                errs_6._4_4_ = (*glad_debug_glCreateShader)(0x8b31);
                uploadShaderSources<char_const*,char_const*>
                          (errs_6._4_4_,&src::version,&src::onlyPos_vert);
                (*glad_debug_glCompileShader)(errs_6._4_4_);
                uVar1 = errs_6._4_4_;
                tl::Span<char>::Span<32768ul>((Span<char> *)local_128,(char (*) [32768])infoLog);
                local_118 = tg::getShaderCompileErrors(uVar1,(Span<char> *)local_128);
                if (local_118 == (char *)0x0) {
                  errs_7._4_4_ = (*glad_debug_glCreateShader)(0x8b30);
                  uploadShaderSources<char_const*,char_const*>
                            (errs_7._4_4_,&src::version,&src::floorGrid_frag);
                  (*glad_debug_glCompileShader)(errs_7._4_4_);
                  uVar1 = errs_7._4_4_;
                  tl::Span<char>::Span<32768ul>((Span<char> *)&data_2,(char (*) [32768])infoLog);
                  local_138 = tg::getShaderCompileErrors(uVar1,(Span<char> *)&data_2);
                  if (local_138 == (char *)0x0) {
                    errs_8 = (char *)&sd::floorGrid;
                    sd::floorGrid = (*glad_debug_glCreateProgram)();
                    (*glad_debug_glAttachShader)(sd::floorGrid,errs_6._4_4_);
                    (*glad_debug_glAttachShader)(sd::floorGrid,errs_7._4_4_);
                    (*glad_debug_glLinkProgram)(sd::floorGrid);
                    GVar2 = sd::floorGrid;
                    tl::Span<char>::Span<32768ul>((Span<char> *)local_168,(char (*) [32768])infoLog)
                    ;
                    local_158 = tg::getShaderLinkErrors(GVar2,(Span<char> *)local_168);
                    if (local_158 == (char *)0x0) {
                      (*glad_debug_glDetachShader)(sd::floorGrid,errs_6._4_4_);
                      (*glad_debug_glDetachShader)(sd::floorGrid,errs_7._4_4_);
                      (*glad_debug_glDeleteShader)(errs_6._4_4_);
                      (*glad_debug_glDeleteShader)(errs_7._4_4_);
                      _DAT_00404104 =
                           (*glad_debug_glGetUniformLocation)(sd::floorGrid,"u_modelView");
                      _DAT_00404108 =
                           (*glad_debug_glGetUniformLocation)(sd::floorGrid,"u_modelViewProj");
                      _DAT_0040410c = (*glad_debug_glGetUniformLocation)(sd::floorGrid,"u_color");
                      _DAT_00404110 =
                           (*glad_debug_glGetUniformLocation)(sd::floorGrid,"u_distToFloor");
                      for (local_16c = 0; local_16c < 2; local_16c = local_16c + 1) {
                        (*glad_debug_glDeleteShader)((&uStack_14)[local_16c]);
                      }
                      vertShader[0]._3_1_ = true;
                    }
                    else {
                      tl::printError<char_const*>(&local_158);
                      (*glad_debug_glDeleteShader)(errs_6._4_4_);
                      (*glad_debug_glDeleteShader)(errs_7._4_4_);
                      (*glad_debug_glDeleteProgram)(sd::floorGrid);
                      vertShader[0]._3_1_ = false;
                    }
                  }
                  else {
                    tl::printError<char_const*>(&local_138);
                    vertShader[0]._3_1_ = false;
                  }
                }
                else {
                  tl::printError<char_const*>(&local_118);
                  vertShader[0]._3_1_ = false;
                }
              }
              else {
                tl::printError<char_const*>(&local_f8);
                (*glad_debug_glDeleteShader)(errs_3._4_4_);
                (*glad_debug_glDeleteShader)(errs_4._4_4_);
                (*glad_debug_glDeleteProgram)(sd::vertColor);
                vertShader[0]._3_1_ = false;
              }
            }
            else {
              tl::printError<char_const*>(&local_d8);
              vertShader[0]._3_1_ = false;
            }
          }
          else {
            tl::printError<char_const*>(&local_b8);
            vertShader[0]._3_1_ = false;
          }
          return vertShader[0]._3_1_;
        }
        errs_1._0_4_ = (*glad_debug_glCreateShader)(0x8b30);
        uploadShaderSources<char_const*,char_const*>((GLuint)errs_1,&src::version,&src::pbrMetallic)
        ;
        (*glad_debug_glCompileShader)((GLuint)errs_1);
        uVar1 = (GLuint)errs_1;
        tl::Span<char>::Span<32768ul>((Span<char> *)&data,(char (*) [32768])infoLog);
        local_78 = tg::getShaderCompileErrors(uVar1,(Span<char> *)&data);
        if (local_78 != (char *)0x0) break;
        errs_2 = sd::pbrMetallic + (long)errs_1._4_4_ * 0x1c;
        GVar2 = (*glad_debug_glCreateProgram)();
        *(GLuint *)errs_2 = GVar2;
        (*glad_debug_glAttachShader)(*(GLuint *)errs_2,(&uStack_14)[errs_1._4_4_]);
        (*glad_debug_glAttachShader)(*(GLuint *)errs_2,(GLuint)errs_1);
        (*glad_debug_glLinkProgram)(*(GLuint *)errs_2);
        uVar1 = *(u32 *)errs_2;
        tl::Span<char>::Span<32768ul>((Span<char> *)local_a8,(char (*) [32768])infoLog);
        local_98 = tg::getShaderLinkErrors(uVar1,(Span<char> *)local_a8);
        if (local_98 != (char *)0x0) {
          tl::printError<char_const*>(&local_98);
          (*glad_debug_glDeleteShader)((GLuint)errs_1);
          (*glad_debug_glDeleteProgram)(*(GLuint *)errs_2);
          return false;
        }
        findAllUnifLocations((ShaderData *)errs_2);
        if (errs_1._4_4_ == 0) {
          local_188 = -1;
        }
        else {
          local_188 = (*glad_debug_glGetUniformLocation)(*(GLuint *)errs_2,"u_jointMatrices");
        }
        *(GLint *)(errs_2 + 0x18) = local_188;
        (*glad_debug_glDetachShader)(*(GLuint *)errs_2,(&uStack_14)[errs_1._4_4_]);
        (*glad_debug_glDetachShader)(*(GLuint *)errs_2,(GLuint)errs_1);
        (*glad_debug_glDeleteShader)((GLuint)errs_1);
        (*glad_debug_glUseProgram)(*(GLuint *)errs_2);
        (*glad_debug_glUniform1i)(*(GLint *)(errs_2 + 0x10),0);
        (*glad_debug_glUniform1i)(*(GLint *)(errs_2 + 0x14),1);
        errs_1._4_4_ = errs_1._4_4_ + 1;
      }
      tl::printError<char_const*>(&local_78);
      return false;
    }
    GVar2 = (*glad_debug_glCreateShader)(0x8b31);
    (&uStack_14)[local_18] = GVar2;
    if (local_18 == 0) {
      uploadShaderSources<char_const*,char_const*>(uStack_14,&src::version,&src::basicVertShader);
    }
    else {
      scratchStr();
      __s = tl::Span<char>::begin(&local_28);
      scratchStr();
      __maxlen = tl::Span<char>::size(&local_38);
      snprintf(__s,__maxlen,
               "\nuniform mat3 u_modelMat3;\nuniform mat4 u_modelViewProj;\nuniform vec4 u_color;\n#define MAX_BONES %d\nuniform mat4 u_jointMatrices[MAX_BONES];\n\nlayout(location = 0) in vec3 a_pos;\nlayout(location = 1) in vec3 a_normal;\nlayout(location = 2) in vec3 a_tangent;\nlayout(location = 3) in vec3 a_bitangent;\nlayout(location = 4) in vec2 a_texCoord0;\nlayout(location = 5) in vec2 a_texCoord1;\nlayout(location = 6) in vec4 a_color;\nlayout(location = 7) in uvec4 a_jointInds;\nlayout(location = 8) in vec4 a_jointWeights;\n\nout vec3 v_normal;\nout vec3 v_tangent;\nout vec3 v_bitangent;\nout vec2 v_texCoord0;\nout vec2 v_texCoord1;\nout vec4 v_color;\n\nvoid main()\n{\n    mat4 skinMtx =\n        a_jointWeights[0] * u_jointMatrices[a_jointInds[0]] +\n        a_jointWeights[1] * u_jointMatrices[a_jointInds[1]] +\n        a_jointWeights[2] * u_jointMatrices[a_jointInds[2]] +\n        a_jointWeights[3] * u_jointMatrices[a_jointInds[3]];\n    gl_Position = u_modelViewProj * skinMtx * vec4(a_pos, 1.0);\n    mat3 modelSkin3 = u_modelMat3 * mat3(skinMtx);\n    v_normal = modelSkin3 * a_normal;\n    v_tangent = modelSkin3 * a_tangent;\n    v_bitangent = modelSkin3 * a_bitangent;\n    v_texCoord0 = a_texCoord0;\n    v_texCoord1 = a_texCoord1;\n    v_color = u_color * a_color;\n}\n\n"
               ,0x40);
      uVar1 = (&uStack_14)[local_18];
      scratchStr();
      local_40 = tl::Span<char>::begin((Span<char> *)&errs);
      uploadShaderSources<char_const*,char*>(uVar1,&src::version,&local_40);
    }
    (*glad_debug_glCompileShader)((&uStack_14)[local_18]);
    uVar1 = (&uStack_14)[local_18];
    tl::Span<char>::Span<32768ul>((Span<char> *)&fragShader,(char (*) [32768])infoLog);
    local_58 = tg::getShaderCompileErrors(uVar1,(Span<char> *)&fragShader);
    if (local_58 != (char *)0x0) break;
    local_18 = local_18 + 1;
    local_58 = (char *)0x0;
  }
  tl::printError<char_const*>(&local_58);
  return false;
}

Assistant:

bool buildShaders()
{
    u32 vertShader[2];
    for(int skinning = 0; skinning < 2; skinning++) {
        vertShader[skinning] = glCreateShader(GL_VERTEX_SHADER);
        if(skinning) {
            snprintf(scratchStr().begin(), scratchStr().size(), src::skinningVertShader, MAX_NUM_JOINTS);
            uploadShaderSources(vertShader[skinning], src::version, scratchStr().begin());
        }
        else {
            uploadShaderSources(vertShader[skinning], src::version, src::basicVertShader);
        }
        glCompileShader(vertShader[skinning]);
        if(const char* errs = tg::getShaderCompileErrors(vertShader[skinning], infoLog)) {
            tl::printError(errs);
            return false;
        }
    }

    // metallic
    for(int skinning = 0; skinning < 2; skinning++) {
        const u32 fragShader = glCreateShader(GL_FRAGMENT_SHADER);
        uploadShaderSources(fragShader, src::version, src::pbrMetallic);
        glCompileShader(fragShader);
        if(const char* errs = tg::getShaderCompileErrors(fragShader, infoLog)) {
            tl::printError(errs);
            return false;
        }

        auto& data = sd::pbrMetallic[skinning];
        data.prog = glCreateProgram();
        glAttachShader(data.prog, vertShader[skinning]);
        glAttachShader(data.prog, fragShader);
        glLinkProgram(data.prog);
        if(const char* errs = tg::getShaderLinkErrors(data.prog, infoLog)) {
            tl::printError(errs);
            glDeleteShader(fragShader);
            glDeleteProgram(data.prog);
            return false;
        }
        findAllUnifLocations(data);
        data.unifLocs.jointMatrices = skinning ? glGetUniformLocation(data.prog, "u_jointMatrices") : -1;
        glDetachShader(data.prog, vertShader[skinning]);
        glDetachShader(data.prog, fragShader);
        glDeleteShader(fragShader);
        glUseProgram(data.prog);
        glUniform1i(data.unifLocs.colorTexture, int(ETexUnit::ALBEDO));
        glUniform1i(data.unifLocs.normalTexture, int(ETexUnit::NORMAL));
    }

    { // shader vert color
        const u32 vertShad = glCreateShader(GL_VERTEX_SHADER);
        uploadShaderSources(vertShad, src::version, src::vertColor_vert);
        glCompileShader(vertShad);
        if(const char* errs = tg::getShaderCompileErrors(vertShad, infoLog)) {
            tl::printError(errs);
            return false;
        }

        const u32 fragShad = glCreateShader(GL_FRAGMENT_SHADER);
        uploadShaderSources(fragShad, src::version, src::vertColor_frag);
        glCompileShader(fragShad);
        if(const char* errs = tg::getShaderCompileErrors(fragShad, infoLog)) {
            tl::printError(errs);
            return false;
        }

        auto& data = sd::vertColor;
        data.prog = glCreateProgram();
        glAttachShader(data.prog, vertShad);
        glAttachShader(data.prog, fragShad);
        glLinkProgram(data.prog);
        if(const char* errs = tg::getShaderLinkErrors(data.prog, infoLog)) {
            tl::printError(errs);
            glDeleteShader(vertShad);
            glDeleteShader(fragShad);
            glDeleteProgram(data.prog);
            return false;
        }
        glDetachShader(data.prog, vertShad);
        glDetachShader(data.prog, fragShad);
        glDeleteShader(vertShad);
        glDeleteShader(fragShad);

        data.locs.modelViewProj = glGetUniformLocation(data.prog, "u_modelViewProj");
    }

    { // shader floor grid
        const u32 vertShad = glCreateShader(GL_VERTEX_SHADER);
        uploadShaderSources(vertShad, src::version, src::onlyPos_vert);
        glCompileShader(vertShad);
        if(const char* errs = tg::getShaderCompileErrors(vertShad, infoLog)) {
            tl::printError(errs);
            return false;
        }

        const u32 fragShad = glCreateShader(GL_FRAGMENT_SHADER);
        uploadShaderSources(fragShad, src::version, src::floorGrid_frag);
        glCompileShader(fragShad);
        if(const char* errs = tg::getShaderCompileErrors(fragShad, infoLog)) {
            tl::printError(errs);
            return false;
        }

        auto& data = sd::floorGrid;
        data.prog = glCreateProgram();
        glAttachShader(data.prog, vertShad);
        glAttachShader(data.prog, fragShad);
        glLinkProgram(data.prog);
        if(const char* errs = tg::getShaderLinkErrors(data.prog, infoLog)) {
            tl::printError(errs);
            glDeleteShader(vertShad);
            glDeleteShader(fragShad);
            glDeleteProgram(data.prog);
            return false;
        }
        glDetachShader(data.prog, vertShad);
        glDetachShader(data.prog, fragShad);
        glDeleteShader(vertShad);
        glDeleteShader(fragShad);

        data.locs.modelView = glGetUniformLocation(data.prog, "u_modelView");
        data.locs.modelViewProj = glGetUniformLocation(data.prog, "u_modelViewProj");
        data.locs.color = glGetUniformLocation(data.prog, "u_color");
        data.locs.distToFloor = glGetUniformLocation(data.prog, "u_distToFloor");
    }

    for(int skinning = 0; skinning < 2; skinning++)
        glDeleteShader(vertShader[skinning]);
    return true;
}